

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O0

void __thiscall
slang::ast::StreamingConcatenationExpression::visitExprs<slang::ast::DriverVisitor&>
          (StreamingConcatenationExpression *this,DriverVisitor *visitor)

{
  bool bVar1;
  StreamingConcatenationExpression *in_RDI;
  StreamExpression *stream;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range3;
  DriverVisitor *in_stack_ffffffffffffffb8;
  Expression *in_stack_ffffffffffffffc0;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_28;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *local_18;
  
  local_28 = streams(in_RDI);
  local_18 = &local_28;
  local_30._M_current =
       (StreamExpression *)
       std::
       span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
       ::begin((span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                *)in_stack_ffffffffffffffb8);
  std::
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffc0 =
         (Expression *)
         __gnu_cxx::
         __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
         ::operator*(&local_30);
    not_null<const_slang::ast::Expression_*>::operator->
              ((not_null<const_slang::ast::Expression_*> *)0x9e30ea);
    Expression::visit<slang::ast::DriverVisitor&>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if ((in_stack_ffffffffffffffc0->type).ptr != (Type *)0x0) {
      Expression::visit<slang::ast::DriverVisitor&>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StreamingConcatenationExpression::StreamExpression_*,_std::span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& stream : streams()) {
            stream.operand->visit(visitor);
            if (stream.withExpr)
                stream.withExpr->visit(visitor);
        }
    }